

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IReferenceCounted.h
# Opt level: O2

void __thiscall irr::scene::CMeshCache::CMeshCache(CMeshCache *this)

{
  *(undefined ***)&this->field_0x28 = &PTR__IReferenceCounted_0027ba48;
  *(undefined8 *)&this->field_0x30 = 0;
  *(undefined4 *)&this->field_0x38 = 1;
  (this->super_IMeshCache)._vptr_IMeshCache = (_func_int **)&PTR__IMeshCache_0027fea0;
  *(undefined ***)&this->field_0x28 = &PTR__IMeshCache_0027ff30;
  (this->super_IMeshCache)._vptr_IMeshCache = (_func_int **)0x27fdc8;
  *(undefined8 *)&this->field_0x28 = 0x27fe58;
  *(undefined8 *)&(this->super_IMeshCache).field_0x8 = 0;
  *(undefined8 *)&(this->super_IMeshCache).field_0x10 = 0;
  *(undefined8 *)&(this->super_IMeshCache).field_0x18 = 0;
  this->field_0x20 = 1;
  return;
}

Assistant:

IReferenceCounted() :
			DebugName(0), ReferenceCounter(1)
	{
	}